

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_DefineProperty(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,JSValue getter,
                     JSValue setter,int flags)

{
  ushort uVar1;
  JSAtom JVar2;
  JSShape *pJVar3;
  int *piVar4;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  bool bVar7;
  bool bVar8;
  JSValue val_00;
  JSShapeProperty *prs_00;
  int iVar9;
  BOOL BVar10;
  int iVar11;
  JSRefCountHeader *p_6;
  JSValueUnion JVar12;
  JSValueUnion *pJVar13;
  uint uVar14;
  char *fmt;
  JSRefCountHeader *p_12;
  uint uVar15;
  JSRuntime *rt;
  ulong uVar16;
  JSFloat64Union u;
  char cVar17;
  JSValue v;
  JSValue v_00;
  JSValue op1;
  JSValue v_01;
  JSValue this_obj_00;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue JVar18;
  JSValue val_01;
  JSValue val_02;
  JSValueUnion local_70;
  JSValueUnion local_60;
  JSShapeProperty *prs;
  JSValueUnion local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  uint32_t array_length;
  int64_t local_38;
  
  local_70 = (JSValueUnion)val.tag;
  local_60 = val.u;
  local_38 = this_obj.tag;
  this_obj_00.u = this_obj.u;
  if ((int)this_obj.tag == -1) {
    local_50.ptr = (void *)(CONCAT44(local_50._4_4_,prop) & 0xffffffff7fffffff);
    local_40 = (uint)flags >> 8;
    local_44 = (flags & local_40 | ~local_40) & 7 ^ 7;
    local_48 = flags & 0x1800;
    bVar7 = local_48 == 0;
    bVar8 = local_44 == 0;
    do {
      pJVar3 = *(JSShape **)((long)this_obj_00.u.ptr + 0x18);
      uVar14 = (&(pJVar3->header).ref_count)[~(ulong)(pJVar3->prop_hash_mask & prop)];
      uVar15 = local_70._0_4_;
      if (uVar14 != 0) {
LAB_0011f2f4:
        uVar16 = (ulong)uVar14;
        prs = (JSShapeProperty *)(&pJVar3->proto + uVar16);
        if (*(JSAtom *)((long)&pJVar3->proto + uVar16 * 8 + 4) != prop) goto code_r0x0011f305;
        pJVar13 = (JSValueUnion *)(*(JSProperty **)((long)this_obj_00.u.ptr + 0x20) + (uVar16 - 1));
        uVar14 = *(uint *)prs;
        if ((((uint)flags >> 0xd & 1) != 0) && ((uVar14 & 0x20000000) != 0)) {
          if (0xfffffff4 < uVar15) {
            *(int *)local_60.ptr = *local_60.ptr + 1;
          }
          JVar18.tag = (int64_t)local_70.ptr;
          JVar18.u.float64 = local_60.float64;
          iVar9 = JS_ToArrayLengthFree(ctx,&array_length,JVar18,0);
          if (iVar9 != 0) {
            return -1;
          }
          JVar12 = (JSValueUnion)(long)(int)array_length;
          local_60.float64 = (double)array_length;
          if (-1 < (long)JVar12.ptr) {
            local_60 = JVar12;
          }
          local_70.float64 = 3.45845952088873e-323;
          if (-1 < (long)JVar12.ptr) {
            local_70.float64 = 0.0;
          }
          pJVar3 = *(JSShape **)((long)this_obj_00.u.ptr + 0x18);
          uVar16 = (ulong)(uint)(&(pJVar3->header).ref_count)
                                [~(ulong)(pJVar3->prop_hash_mask & prop)];
          prs = (JSShapeProperty *)(&pJVar3->proto + uVar16);
          JVar2 = *(JSAtom *)((long)&pJVar3->proto + uVar16 * 8 + 4);
          while (JVar2 != prop) {
            uVar16 = (ulong)(*(uint *)prs & 0x3ffffff);
            prs = (JSShapeProperty *)(&pJVar3->proto + uVar16);
            JVar2 = *(JSAtom *)((long)&pJVar3->proto + uVar16 * 8 + 4);
          }
          pJVar13 = (JSValueUnion *)
                    (*(JSProperty **)((long)this_obj_00.u.ptr + 0x20) + (uVar16 - 1));
          uVar14 = *(uint *)prs;
        }
        prs_00 = prs;
        BVar10 = check_define_prop_flags(uVar14 >> 0x1a,flags);
        if (BVar10 == 0) goto LAB_0011f974;
        uVar15 = uVar14 >> 0x1a & 0xfffffff0;
        if (uVar15 != 0x30) {
          if ((flags & 0x3a00U) == 0) goto LAB_0011fba5;
          if ((flags & 0x1800U) == 0) {
            if (uVar15 != 0x20) {
              if (uVar15 == 0x10) {
                iVar9 = js_shape_prepare_update(ctx,(JSObject *)this_obj_00.u.ptr,&prs);
                if (iVar9 != 0) {
                  return -1;
                }
                JVar12.ptr = pJVar13->ptr;
                if (((int *)JVar12.ptr != (int *)0x0) &&
                   (iVar9 = *JVar12.ptr, *(int *)JVar12.ptr = iVar9 + -1, iVar9 < 2)) {
                  v.tag = -1;
                  v.u.ptr = JVar12.ptr;
                  __JS_FreeValueRT(ctx->rt,v);
                }
                JVar12 = (JSValueUnion)pJVar13[1].ptr;
                if (((int *)JVar12.ptr != (int *)0x0) &&
                   (iVar9 = *JVar12.ptr, *(int *)JVar12.ptr = iVar9 + -1, iVar9 < 2)) {
                  v_00.tag = -1;
                  v_00.u.ptr = JVar12.ptr;
                  __JS_FreeValueRT(ctx->rt,v_00);
                }
                *(uint *)prs = *(uint *)prs & 0x37ffffff;
                pJVar13->int32 = 0;
                pJVar13[1].float64 = 1.48219693752374e-323;
                uVar14 = *(uint *)prs;
              }
              else if ((((uint)flags >> 0xd & 1) != 0) && ((uVar14 & 0xc000000) == 0)) {
                op1.tag = (int64_t)local_70.ptr;
                op1.u.float64 = local_60.float64;
                BVar10 = js_same_value(ctx,op1,*(JSValue *)pJVar13);
                if (BVar10 != 0) {
                  return 1;
                }
                goto LAB_0011f974;
              }
            }
            if ((uVar14 >> 0x1d & 1) != 0) {
              iVar9 = 1;
              if (((uint)flags >> 0xd & 1) != 0) {
                if (0xfffffff4 < (uint)local_70._0_4_) {
                  *(int *)local_60.ptr = *local_60.ptr + 1;
                }
                val_02.tag = (int64_t)local_70.ptr;
                val_02.u.float64 = local_60.float64;
                iVar9 = set_array_length(ctx,(JSObject *)this_obj_00.u.ptr,val_02,flags);
              }
              if ((flags & 0x202U) == 0x200) {
                prs = (JSShapeProperty *)(*(JSShape **)((long)this_obj_00.u.ptr + 0x18) + 1);
                iVar11 = js_update_property_flags
                                   (ctx,(JSObject *)this_obj_00.u.ptr,&prs,
                                    (uint)(*(JSShape **)((long)this_obj_00.u.ptr + 0x18))[1].header.
                                          ref_count >> 0x1a & 0xfffffffd);
                if (iVar11 != 0) {
                  return -1;
                }
              }
              return iVar9;
            }
            if (((uint)flags >> 0xd & 1) != 0) {
              JVar12 = pJVar13[1];
              if (0xfffffff4 < (uint)JVar12.int32) {
                JVar6.ptr = pJVar13->ptr;
                iVar9 = *JVar6.ptr;
                *(int *)JVar6.ptr = iVar9 + -1;
                if (iVar9 < 2) {
                  v_01.tag = (int64_t)JVar12.ptr;
                  v_01.u.ptr = JVar6.ptr;
                  __JS_FreeValueRT(ctx->rt,v_01);
                }
              }
              if (0xfffffff4 < (uint)local_70._0_4_) {
                *(int *)local_60.ptr = *local_60.ptr + 1;
              }
              *(JSValueUnion *)&pJVar13->int32 = local_60;
              pJVar13[1] = local_70;
            }
            if ((((uint)flags >> 9 & 1) != 0) &&
               (iVar9 = js_update_property_flags
                                  (ctx,(JSObject *)this_obj_00.u.ptr,&prs,
                                   flags & 2U | *(uint *)prs >> 0x1a & 0xfffffffd), iVar9 != 0)) {
              return -1;
            }
            goto LAB_0011fba5;
          }
          if ((uint)getter.tag == 0xffffffff) {
            uVar1 = *(ushort *)((long)getter.u.ptr + 6);
            JVar12 = getter.u;
            if (uVar1 != 0xd) {
              if (uVar1 == 0x29) {
                cVar17 = *(char *)(*(long *)((long)getter.u.ptr + 0x30) + 0x20);
              }
              else {
                cVar17 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
              }
              if (cVar17 == '\0') goto LAB_0011f8c9;
            }
          }
          else {
LAB_0011f8c9:
            JVar12.float64 = 0.0;
          }
          if ((uint)setter.tag == 0xffffffff) {
            uVar1 = *(ushort *)((long)setter.u.ptr + 6);
            if (uVar1 != 0xd) {
              if (uVar1 == 0x29) {
                cVar17 = *(char *)(*(long *)((long)setter.u.ptr + 0x30) + 0x20);
              }
              else {
                cVar17 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
              }
              if (cVar17 == '\0') goto LAB_0011f922;
            }
            local_70 = setter.u;
          }
          else {
LAB_0011f922:
            local_70.float64 = 0.0;
          }
          local_50 = setter.u;
          if ((uVar14 & 0xc0000000) == 0x40000000) {
            if (((uVar14 >> 0x1a & 1) == 0) &&
               (((((uint)flags >> 0xb & 1) != 0 && (JVar12.ptr != pJVar13->ptr)) ||
                ((((uint)flags >> 0xc & 1) != 0 && (local_70.ptr != pJVar13[1].ptr)))))) {
LAB_0011f974:
              iVar9 = JS_ThrowTypeErrorOrFalse(ctx,flags,"property is not configurable");
              return iVar9;
            }
          }
          else {
            iVar9 = js_shape_prepare_update(ctx,(JSObject *)this_obj_00.u.ptr,&prs);
            if (iVar9 != 0) {
              return -1;
            }
            JVar6 = pJVar13[1];
            if (0xfffffff4 < (uint)JVar6.int32) {
              JVar5.ptr = pJVar13->ptr;
              iVar9 = *JVar5.ptr;
              *(int *)JVar5.ptr = iVar9 + -1;
              if (iVar9 < 2) {
                v_02.tag = (int64_t)JVar6.ptr;
                v_02.u.ptr = JVar5.ptr;
                __JS_FreeValueRT(ctx->rt,v_02);
              }
            }
            *(uint *)prs = *(uint *)prs & 0x17ffffff | 0x40000000;
            pJVar13->float64 = 0.0;
            pJVar13[1].float64 = 0.0;
          }
          if (((uint)flags >> 0xb & 1) != 0) {
            JVar6.ptr = pJVar13->ptr;
            if (((int *)JVar6.ptr != (int *)0x0) &&
               (iVar9 = *JVar6.ptr, *(int *)JVar6.ptr = iVar9 + -1, iVar9 < 2)) {
              v_03.tag = -1;
              v_03.u.ptr = JVar6.ptr;
              __JS_FreeValueRT(ctx->rt,v_03);
            }
            if (0xfffffff4 < (uint)getter.tag && JVar12.ptr != (void *)0x0) {
              *(int *)getter.u.ptr = *getter.u.ptr + 1;
            }
            pJVar13->ptr = (void *)JVar12;
          }
          if (((uint)flags >> 0xc & 1) != 0) {
            JVar12 = (JSValueUnion)pJVar13[1].ptr;
            if (((int *)JVar12.ptr != (int *)0x0) &&
               (iVar9 = *JVar12.ptr, *(int *)JVar12.ptr = iVar9 + -1, iVar9 < 2)) {
              v_04.tag = -1;
              v_04.u.ptr = JVar12.ptr;
              __JS_FreeValueRT(ctx->rt,v_04);
            }
            if (0xfffffff4 < (uint)setter.tag && local_70.ptr != (void *)0x0) {
              *(int *)local_50.ptr = *local_50.ptr + 1;
            }
            pJVar13[1] = local_70;
          }
LAB_0011fba5:
          iVar9 = js_update_property_flags
                            (ctx,(JSObject *)this_obj_00.u.ptr,&prs,
                             local_40 & (flags ^ *(uint *)prs >> 0x1a) & 5 ^ *(uint *)prs >> 0x1a);
          return -(uint)(iVar9 != 0) | 1;
        }
        iVar9 = JS_AutoInitProperty(ctx,(JSObject *)this_obj_00.u.ptr,prop,(JSProperty *)pJVar13,
                                    prs_00);
        goto LAB_0011f459;
      }
LAB_0011f311:
      prs = (JSShapeProperty *)0x0;
      if ((*(byte *)((long)this_obj_00.u.ptr + 5) & 8) == 0) {
LAB_0011f54d:
        val_01.tag = (int64_t)local_70.ptr;
        val_01.u.float64 = local_60.float64;
        iVar9 = JS_CreateProperty(ctx,(JSObject *)this_obj_00.u.ptr,prop,val_01,getter,setter,flags)
        ;
        return iVar9;
      }
      uVar1 = *(ushort *)((long)this_obj_00.u.ptr + 6);
      if ((ulong)uVar1 != 2) {
        if (8 < (ushort)(uVar1 - 0x15)) goto LAB_0011f54d;
        if ((int)prop < 0) {
          if ((uint)local_50._0_4_ <
              ((anon_union_24_22_bbf4f0e3_for_u *)((long)this_obj_00.u.ptr + 0x30))->typed_array->
              length >> ("includes"[(ulong)uVar1 + 1] & 0x1fU)) {
            if (local_48 == 0 && local_44 == 0) {
              if (((uint)flags >> 0xd & 1) != 0) {
                if (0xfffffff4 < uVar15) {
                  *(int *)local_60.ptr = *local_60.ptr + 1;
                }
                val_00.tag._0_4_ = flags;
                val_00.u.float64 = local_70.float64;
                val_00.tag._4_4_ = 0;
                this_obj_00.tag = local_38;
                iVar9 = JS_SetPropertyValue(ctx,this_obj_00,(JSValue)ZEXT416((uint)local_50._0_4_),
                                            val_00,local_60.int32);
                return iVar9;
              }
              return 1;
            }
            fmt = "invalid descriptor flags";
            goto LAB_0011fcbc;
          }
        }
        else {
          JVar18 = JS_AtomIsNumericIndex1(ctx,prop);
          JVar12 = JVar18.u;
          iVar9 = -1;
          uVar14 = (uint)JVar18.tag;
          if (uVar14 == 6) {
            return -1;
          }
          if (uVar14 == 3) goto LAB_0011f54d;
          iVar11 = JS_NumberIsInteger(ctx,JVar18);
          if (iVar11 < 0) {
            if (uVar14 < 0xfffffff5) {
              return -1;
            }
            iVar11 = *JVar12.ptr;
            *(int *)JVar12.ptr = iVar11 + -1;
            if (1 < iVar11) {
              return -1;
            }
            rt = ctx->rt;
            goto LAB_0011f5d1;
          }
          if (iVar11 == 0) {
            if ((0xfffffff4 < uVar14) &&
               (iVar9 = *JVar12.ptr, *(int *)JVar12.ptr = iVar9 + -1, iVar9 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar18);
            }
            fmt = "non integer index in typed array";
            goto LAB_0011fcbc;
          }
          if (uVar14 == 7) {
            uVar14 = JVar18.u._4_4_ >> 0x1f;
          }
          else {
            if (uVar14 != 0) {
              if ((0xfffffff4 < uVar14) &&
                 (iVar9 = *JVar12.ptr, *(int *)JVar12.ptr = iVar9 + -1, iVar9 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar18);
              }
              goto LAB_0011fcb5;
            }
            uVar14 = (uint)((ulong)JVar12.ptr >> 0x1f) & 1;
          }
          if (uVar14 != 0) {
            fmt = "negative index in typed array";
            goto LAB_0011fcbc;
          }
        }
LAB_0011fcb5:
        fmt = "out-of-bound index in typed array";
LAB_0011fcbc:
        iVar9 = JS_ThrowTypeErrorOrFalse(ctx,flags,fmt);
        return iVar9;
      }
      if ((-1 < (int)prop) || (*(uint *)((long)this_obj_00.u.ptr + 0x40) <= (uint)local_50._0_4_))
      goto LAB_0011f54d;
      if (bVar7 && bVar8) {
        iVar9 = 1;
        if (((uint)flags >> 0xd & 1) == 0) {
          return 1;
        }
        pJVar13 = (JSValueUnion *)
                  (((ulong)local_50.ptr & 0xffffffff) * 0x10 +
                  *(long *)((long)this_obj_00.u.ptr + 0x38));
        if (0xfffffff4 < uVar15) {
          *(int *)local_60.ptr = *local_60.ptr + 1;
        }
        piVar4 = (int *)pJVar13->ptr;
        JVar12 = pJVar13[1];
        JVar18 = *(JSValue *)pJVar13;
        *(JSValueUnion *)&pJVar13->int32 = local_60;
        pJVar13[1] = local_70;
        if ((uint)JVar12.int32 < 0xfffffff5) {
          return 1;
        }
        iVar11 = *piVar4;
        *piVar4 = iVar11 + -1;
        if (1 < iVar11) {
          return 1;
        }
        rt = ctx->rt;
LAB_0011f5d1:
        __JS_FreeValueRT(rt,JVar18);
        return iVar9;
      }
      iVar9 = convert_fast_array_to_array(ctx,(JSObject *)this_obj_00.u.ptr);
LAB_0011f459:
    } while (iVar9 == 0);
  }
  else {
    JS_ThrowTypeError(ctx,"not an object");
  }
  return -1;
code_r0x0011f305:
  uVar14 = *(uint *)prs & 0x3ffffff;
  if (uVar14 == 0) goto LAB_0011f311;
  goto LAB_0011f2f4;
}

Assistant:

int JS_DefineProperty(JSContext *ctx, JSValueConst this_obj,
                      JSAtom prop, JSValueConst val,
                      JSValueConst getter, JSValueConst setter, int flags)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;
    int mask, res;

    if (JS_VALUE_GET_TAG(this_obj) != JS_TAG_OBJECT) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    p = JS_VALUE_GET_OBJ(this_obj);

 redo_prop_update:
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* the range of the Array length property is always tested before */
        if ((prs->flags & JS_PROP_LENGTH) && (flags & JS_PROP_HAS_VALUE)) {
            uint32_t array_length;
            if (JS_ToArrayLengthFree(ctx, &array_length,
                                     JS_DupValue(ctx, val), FALSE)) {
                return -1;
            }
            /* this code relies on the fact that Uint32 are never allocated */
            val = (JSValueConst)JS_NewUint32(ctx, array_length);
            /* prs may have been modified */
            prs = find_own_property(&pr, p, prop);
            assert(prs != NULL);
        }
        /* property already exists */
        if (!check_define_prop_flags(prs->flags, flags)) {
        not_configurable:
            return JS_ThrowTypeErrorOrFalse(ctx, flags, "property is not configurable");
        }

        if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
            /* Instantiate property and retry */
            if (JS_AutoInitProperty(ctx, p, prop, pr, prs))
                return -1;
            goto redo_prop_update;
        }

        if (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE |
                     JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
            if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
                JSObject *new_getter, *new_setter;

                if (JS_IsFunction(ctx, getter)) {
                    new_getter = JS_VALUE_GET_OBJ(getter);
                } else {
                    new_getter = NULL;
                }
                if (JS_IsFunction(ctx, setter)) {
                    new_setter = JS_VALUE_GET_OBJ(setter);
                } else {
                    new_setter = NULL;
                }

                if ((prs->flags & JS_PROP_TMASK) != JS_PROP_GETSET) {
                    if (js_shape_prepare_update(ctx, p, &prs))
                        return -1;
                    /* convert to getset */
                    if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                        free_var_ref(ctx->rt, pr->u.var_ref);
                    } else {
                        JS_FreeValue(ctx, pr->u.value);
                    }
                    prs->flags = (prs->flags &
                                  (JS_PROP_CONFIGURABLE | JS_PROP_ENUMERABLE)) |
                        JS_PROP_GETSET;
                    pr->u.getset.getter = NULL;
                    pr->u.getset.setter = NULL;
                } else {
                    if (!(prs->flags & JS_PROP_CONFIGURABLE)) {
                        if ((flags & JS_PROP_HAS_GET) &&
                            new_getter != pr->u.getset.getter) {
                            goto not_configurable;
                        }
                        if ((flags & JS_PROP_HAS_SET) &&
                            new_setter != pr->u.getset.setter) {
                            goto not_configurable;
                        }
                    }
                }
                if (flags & JS_PROP_HAS_GET) {
                    if (pr->u.getset.getter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.getter));
                    if (new_getter)
                        JS_DupValue(ctx, getter);
                    pr->u.getset.getter = new_getter;
                }
                if (flags & JS_PROP_HAS_SET) {
                    if (pr->u.getset.setter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.setter));
                    if (new_setter)
                        JS_DupValue(ctx, setter);
                    pr->u.getset.setter = new_setter;
                }
            } else {
                if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
                    /* convert to data descriptor */
                    if (js_shape_prepare_update(ctx, p, &prs))
                        return -1;
                    if (pr->u.getset.getter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.getter));
                    if (pr->u.getset.setter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.setter));
                    prs->flags &= ~(JS_PROP_TMASK | JS_PROP_WRITABLE);
                    pr->u.value = JS_UNDEFINED;
                } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                    /* Note: JS_PROP_VARREF is always writable */
                } else {
                    if ((prs->flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0 &&
                        (flags & JS_PROP_HAS_VALUE)) {
                        if (!js_same_value(ctx, val, pr->u.value)) {
                            goto not_configurable;
                        } else {
                            return TRUE;
                        }
                    }
                }
                if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                    if (flags & JS_PROP_HAS_VALUE) {
                        if (p->class_id == JS_CLASS_MODULE_NS) {
                            /* JS_PROP_WRITABLE is always true for variable
                               references, but they are write protected in module name
                               spaces. */
                            if (!js_same_value(ctx, val, *pr->u.var_ref->pvalue))
                                goto not_configurable;
                        }
                        /* update the reference */
                        set_value(ctx, pr->u.var_ref->pvalue,
                                  JS_DupValue(ctx, val));
                    }
                    /* if writable is set to false, no longer a
                       reference (for mapped arguments) */
                    if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) == JS_PROP_HAS_WRITABLE) {
                        JSValue val1;
                        if (js_shape_prepare_update(ctx, p, &prs))
                            return -1;
                        val1 = JS_DupValue(ctx, *pr->u.var_ref->pvalue);
                        free_var_ref(ctx->rt, pr->u.var_ref);
                        pr->u.value = val1;
                        prs->flags &= ~(JS_PROP_TMASK | JS_PROP_WRITABLE);
                    }
                } else if (prs->flags & JS_PROP_LENGTH) {
                    if (flags & JS_PROP_HAS_VALUE) {
                        /* Note: no JS code is executable because
                           'val' is guaranted to be a Uint32 */
                        res = set_array_length(ctx, p, JS_DupValue(ctx, val),
                                               flags);
                    } else {
                        res = TRUE;
                    }
                    /* still need to reset the writable flag if
                       needed.  The JS_PROP_LENGTH is kept because the
                       Uint32 test is still done if the length
                       property is read-only. */
                    if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) ==
                        JS_PROP_HAS_WRITABLE) {
                        prs = get_shape_prop(p->shape);
                        if (js_update_property_flags(ctx, p, &prs,
                                                     prs->flags & ~JS_PROP_WRITABLE))
                            return -1;
                    }
                    return res;
                } else {
                    if (flags & JS_PROP_HAS_VALUE) {
                        JS_FreeValue(ctx, pr->u.value);
                        pr->u.value = JS_DupValue(ctx, val);
                    }
                    if (flags & JS_PROP_HAS_WRITABLE) {
                        if (js_update_property_flags(ctx, p, &prs,
                                                     (prs->flags & ~JS_PROP_WRITABLE) |
                                                     (flags & JS_PROP_WRITABLE)))
                            return -1;
                    }
                }
            }
        }
        mask = 0;
        if (flags & JS_PROP_HAS_CONFIGURABLE)
            mask |= JS_PROP_CONFIGURABLE;
        if (flags & JS_PROP_HAS_ENUMERABLE)
            mask |= JS_PROP_ENUMERABLE;
        if (js_update_property_flags(ctx, p, &prs,
                                     (prs->flags & ~mask) | (flags & mask)))
            return -1;
        return TRUE;
    }

    /* handle modification of fast array elements */
    if (p->fast_array) {
        uint32_t idx;
        uint32_t prop_flags;
        if (p->class_id == JS_CLASS_ARRAY) {
            if (__JS_AtomIsTaggedInt(prop)) {
                idx = __JS_AtomToUInt32(prop);
                if (idx < p->u.array.count) {
                    prop_flags = get_prop_flags(flags, JS_PROP_C_W_E);
                    if (prop_flags != JS_PROP_C_W_E)
                        goto convert_to_slow_array;
                    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
                    convert_to_slow_array:
                        if (convert_fast_array_to_array(ctx, p))
                            return -1;
                        else
                            goto redo_prop_update;
                    }
                    if (flags & JS_PROP_HAS_VALUE) {
                        set_value(ctx, &p->u.array.u.values[idx], JS_DupValue(ctx, val));
                    }
                    return TRUE;
                }
            }
        } else if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                   p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            JSValue num;
            int ret;

            if (!__JS_AtomIsTaggedInt(prop)) {
                /* slow path with to handle all numeric indexes */
                num = JS_AtomIsNumericIndex1(ctx, prop);
                if (JS_IsUndefined(num))
                    goto typed_array_done;
                if (JS_IsException(num))
                    return -1;
                ret = JS_NumberIsInteger(ctx, num);
                if (ret < 0) {
                    JS_FreeValue(ctx, num);
                    return -1;
                }
                if (!ret) {
                    JS_FreeValue(ctx, num);
                    return JS_ThrowTypeErrorOrFalse(ctx, flags, "non integer index in typed array");
                }
                ret = JS_NumberIsNegativeOrMinusZero(ctx, num);
                JS_FreeValue(ctx, num);
                if (ret) {
                    return JS_ThrowTypeErrorOrFalse(ctx, flags, "negative index in typed array");
                }
                if (!__JS_AtomIsTaggedInt(prop))
                    goto typed_array_oob;
            }
            idx = __JS_AtomToUInt32(prop);
            /* if the typed array is detached, p->u.array.count = 0 */
            if (idx >= typed_array_get_length(ctx, p)) {
            typed_array_oob:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound index in typed array");
            }
            prop_flags = get_prop_flags(flags, JS_PROP_ENUMERABLE | JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
            if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET) ||
                prop_flags != (JS_PROP_ENUMERABLE | JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE)) {
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "invalid descriptor flags");
            }
            if (flags & JS_PROP_HAS_VALUE) {
                return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), JS_DupValue(ctx, val), flags);
            }
            return TRUE;
        typed_array_done: ;
        }
    }

    return JS_CreateProperty(ctx, p, prop, val, getter, setter, flags);
}